

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O0

cycle_formatter_yyyymmddhhmm * __thiscall
cornelich::cycle_formatter_yyyymmddhhmm::date_from_cycle_impl_abi_cxx11_
          (cycle_formatter_yyyymmddhhmm *this,int64_t cycle)

{
  day_point *dp;
  precision *this_00;
  type this_01;
  long in_RDX;
  duration<long,_std::ratio<1L,_1000000000L>_> d;
  duration<long,_std::ratio<60L,_1L>_> local_578;
  rep_conflict local_570;
  duration<long,_std::ratio<3600L,_1L>_> local_568;
  rep_conflict local_560;
  day local_551;
  uint local_550;
  month local_549;
  uint local_548;
  year local_542;
  int local_540;
  char local_539;
  int local_538;
  type local_534;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_528;
  char local_511;
  int local_510;
  type local_50c;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_500;
  char local_4e9;
  int local_4e8;
  type local_4e4;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_4d8;
  char local_4c1;
  int local_4c0;
  type local_4bc;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_4b0;
  char local_499;
  int local_498;
  type local_494;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_488;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_478;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_468;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_458;
  expr<_1b4c652e_> local_448 [2];
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_428;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sink;
  undefined1 local_410 [8];
  time_of_day<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tod;
  year_month_day ymd;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
  daypoint;
  duration<long,std::ratio<1l,1000000000l>> local_3d8 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_3d0;
  time_point ts;
  time_t s;
  int64_t cycle_local;
  cycle_formatter_yyyymmddhhmm *this_local;
  string *result;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  that;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_7;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_5;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_3;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_1;
  undefined1 local_261;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 local_241;
  undefined1 *local_240;
  undefined1 local_231;
  undefined1 *local_230;
  undefined1 local_221;
  undefined1 *local_220;
  undefined1 local_211;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  *peStack_1c0;
  expr_type that_2;
  expr_type that_4;
  expr_type that_6;
  expr_type that_8;
  
  ts.__d.__r = (duration)((in_RDX * *(int *)(cycle + 8)) / 1000);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1l>> *)&ymd,(long *)&ts);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            (local_3d8,(duration<long,_std::ratio<1L,_1L>_> *)&ymd);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_3d0,(duration *)local_3d8);
  tod.
  super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
  .sub_s_.__r._4_4_ =
       date::
       floor<std::chrono::duration<int,std::ratio<86400l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (&local_3d0);
  dp = (day_point *)
       ((long)&tod.
               super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
               .sub_s_.__r + 4);
  date::year_month_day::year_month_day
            ((year_month_day *)
             &tod.
              super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
              .sub_s_,dp);
  this_01 = std::chrono::operator-(&local_3d0,dp);
  date::make_time<long,std::ratio<1l,1000000000l>,void>
            ((time_of_day<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)local_410,
             (date *)this_01.__r,d);
  sink.container._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::back_insert_iterator
            (&local_428,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_498 = 4;
  local_499 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_494,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_498,&local_499,(is_false)0x0);
  local_488.child0 = &local_494;
  local_260 = &boost::spirit::int_;
  local_250 = &local_261;
  local_258 = &boost::spirit::int_;
  local_488.child1 = (proto_child1)&boost::spirit::int_;
  local_4c0 = 2;
  local_4c1 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_4bc,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_4c0,&local_4c1,(is_false)0x0);
  local_4b0.child0 = &local_4bc;
  local_240 = &boost::spirit::uint_;
  local_1d0 = &local_241;
  local_1d8 = &boost::spirit::uint_;
  local_4b0.child1 = (proto_child1)&boost::spirit::uint_;
  local_478.child0 = &local_488;
  local_478.child1 = (proto_child1)&local_4b0;
  local_4e8 = 2;
  local_4e9 = '0';
  peStack_1c0 = local_478.child0;
  that_2.child0 = (proto_child0)local_478.child1;
  that_2.child1 = local_478.child1;
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_4e4,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_4e8,&local_4e9,(is_false)0x0);
  local_4d8.child0 = &local_4e4;
  local_230 = &boost::spirit::uint_;
  local_1e0 = &local_231;
  local_1e8 = &boost::spirit::uint_;
  local_4d8.child1 = (proto_child1)&boost::spirit::uint_;
  local_468.child0 = &local_478;
  local_468.child1 = &local_4d8;
  local_510 = 2;
  local_511 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_50c,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_510,&local_511,(is_false)0x0);
  local_500.child0 = &local_50c;
  local_220 = &boost::spirit::uint_;
  local_1f0 = &local_221;
  local_1f8 = &boost::spirit::uint_;
  local_500.child1 = (proto_child1)&boost::spirit::uint_;
  local_458.child0 = &local_468;
  local_458.child1 = &local_500;
  local_538 = 2;
  local_539 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_534,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_538,&local_539,(is_false)0x0);
  local_528.child0 = &local_534;
  local_210 = &boost::spirit::uint_;
  local_200 = &local_211;
  local_208 = &boost::spirit::uint_;
  local_528.child1 = (proto_child1)&boost::spirit::uint_;
  local_448[0].child0 = &local_458;
  local_448[0].child1 = &local_528;
  this_00 = &tod.
             super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
             .sub_s_;
  local_542 = date::year_month_day::year((year_month_day *)this_00);
  local_540 = date::year::operator_cast_to_int(&local_542);
  local_549 = date::year_month_day::month((year_month_day *)this_00);
  local_548 = date::month::operator_cast_to_unsigned_int(&local_549);
  local_551 = date::year_month_day::day((year_month_day *)this_00);
  local_550 = date::day::operator_cast_to_unsigned_int(&local_551);
  local_568.__r =
       (rep_conflict)
       date::detail::
       time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
       ::hours((time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
                *)local_410);
  local_560 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_568);
  local_578.__r =
       (rep_conflict)
       date::detail::
       time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
       ::minutes((time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
                  *)local_410);
  local_570 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_578);
  boost::spirit::karma::
  generate<std::back_insert_iterator<std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex___::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>,int,unsigned_int,unsigned_int,long,long>
            (&local_428,local_448,&local_540,&local_548,&local_550,&local_560,&local_570);
  return this;
}

Assistant:

std::string cycle_formatter_yyyymmddhhmm::date_from_cycle_impl(std::int64_t cycle) const
{
    const auto s = static_cast<std::time_t>(cycle * m_cycle_length / 1000);
    auto ts = system_clock::time_point(seconds(s));
    auto daypoint = floor<days>(ts);
    auto ymd = year_month_day(daypoint);
    auto tod = make_time(ts - daypoint);

    using namespace boost::spirit;

    std::string result;
    std::back_insert_iterator<std::string> sink(result);
    karma::generate(sink,
                    karma::right_align(4, '0')[karma::int_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_],
            int(ymd.year()), unsigned(ymd.month()), unsigned(ymd.day()), tod.hours().count(), tod.minutes().count());
    return result;
}